

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O3

int ncnn::conv3x3s1_winograd23_int8_xop(Mat *bottom_blob,Mat *top_blob,Mat *AT,int nT,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  size_t sVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Mat *top_blob_00;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  undefined1 (*pauVar22) [16];
  ulong *puVar23;
  int *piVar24;
  uint uVar25;
  int *piVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  Mat *pMVar30;
  undefined1 (*pauVar31) [16];
  int iVar32;
  int iVar33;
  ulong *puVar34;
  int iVar35;
  uint K;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar44 [16];
  int TILE_M;
  int TILE_K;
  int TILE_N;
  Mat m;
  int tmp [2] [4] [4];
  Allocator *_allocator;
  ulong local_270;
  uint local_22c;
  Mat *local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  uint local_1dc;
  Mat local_1d8;
  int local_190;
  int local_18c;
  Mat local_188;
  Mat local_108;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  Mat local_a0;
  ulong local_58;
  Mat *local_50;
  long local_48;
  void *local_40;
  long local_38;
  
  auVar39 = in_ZMM1._0_16_;
  iVar15 = cpu_support_x86_avx_vnni();
  if (iVar15 != 0) {
    iVar15 = conv3x3s1_winograd23_int8_avxvnni(bottom_blob,top_blob,AT,nT,opt);
    return iVar15;
  }
  local_228 = top_blob;
  iVar15 = cpu_support_x86_avx2();
  if (iVar15 != 0) {
    iVar15 = conv3x3s1_winograd23_int8_avx2(bottom_blob,local_228,AT,nT,opt);
    return iVar15;
  }
  uVar1 = local_228->w;
  uVar2 = local_228->h;
  auVar41._4_4_ = uVar2;
  auVar41._0_4_ = uVar1;
  auVar39 = vpcmpeqd_avx(auVar39,auVar39);
  auVar41._8_8_ = 0;
  auVar39 = vpsubd_avx(auVar41,auVar39);
  auVar41 = vpsrld_avx(auVar39,0x1f);
  auVar39 = vpaddd_avx(auVar39,auVar41);
  auVar39 = vpsrad_avx(auVar39,1);
  uVar27 = local_228->elempack * local_228->c;
  uVar25 = auVar39._4_4_ * auVar39._0_4_;
  K = bottom_blob->elempack * bottom_blob->c;
  uVar37 = (ulong)K;
  get_optimal_tile_mnk_int8(uVar27,uVar25,K,(int *)&local_22c,(int *)&local_1dc,&local_1e0,nT);
  uVar19 = local_1dc;
  iVar15 = local_1e0;
  local_1e8 = (int)(local_22c + uVar27 + -1) / (int)local_22c;
  iVar32 = (int)(uVar25 + local_1dc + -1) / (int)local_1dc;
  iVar16 = (int)(local_1e0 + K + -1) / local_1e0;
  iVar28 = local_1e0 * local_1dc;
  _allocator = opt->workspace_allocator;
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  local_220 = (ulong)uVar25;
  local_58 = (ulong)uVar27;
  Mat::create(&local_108,iVar28,0x10,iVar16,iVar32,2,_allocator);
  iVar29 = -100;
  if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0))
  goto LAB_00283383;
  iVar32 = iVar32 * iVar16;
  iVar28 = iVar28 * 0x10;
  local_218 = uVar37;
  local_50 = AT;
  if ((nT < 2) || (nT <= iVar32)) {
    local_188.cstep = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    Mat::create(&local_188,iVar28,1,nT,2,opt->workspace_allocator);
    if ((local_188.data == (void *)0x0) || ((long)local_188.c * local_188.cstep == 0)) {
      piVar26 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      iVar29 = -100;
      if (piVar26 == (int *)0x0) goto LAB_00283383;
      LOCK();
      *piVar26 = *piVar26 + -1;
      UNLOCK();
      if (*piVar26 != 0) goto LAB_00283383;
      if (local_188.allocator != (Allocator *)0x0) {
        (*(local_188.allocator)->_vptr_Allocator[3])();
        iVar29 = -100;
        goto LAB_00283383;
      }
      goto LAB_002828ac;
    }
    if (0 < iVar32) {
      iVar29 = 0;
      do {
        iVar28 = (iVar29 / iVar16) * uVar19;
        iVar33 = (iVar29 % iVar16) * iVar15;
        uVar25 = (int)local_220 - iVar28;
        if ((int)uVar19 < (int)uVar25) {
          uVar25 = uVar19;
        }
        iVar35 = (int)local_218 - iVar33;
        if (iVar15 < iVar35) {
          iVar35 = iVar15;
        }
        iVar21 = get_omp_thread_num();
        local_1d8.data =
             (void *)((long)iVar21 * local_188.cstep * local_188.elemsize + (long)local_188.data);
        local_1d8.refcount._0_4_ = 0;
        local_1d8.refcount._4_4_ = 0;
        local_1d8.elemsize = local_188.elemsize;
        local_1d8.elempack = local_188.elempack;
        local_1d8.allocator = local_188.allocator;
        local_1d8.w = local_188.w;
        local_1d8.h = local_188.h;
        local_1d8.d = 1;
        local_1d8.c = local_188.d;
        local_1d8.dims = local_188.dims + -1;
        local_1d8.cstep =
             (local_188.elemsize * (long)local_188.h * (long)local_188.w + 0xf & 0xfffffffffffffff0)
             / local_188.elemsize;
        if (local_188.dims == 4) {
          local_1d8.cstep = (long)local_188.h * (long)local_188.w;
        }
        conv3x3s1_winograd23_transform_input_tile_int8
                  (bottom_blob,&local_1d8,iVar28,uVar25,iVar33,iVar35,(int)_allocator);
        local_a0.cstep = (long)local_108.h * (long)local_108.w;
        local_a0.data =
             (void *)((long)local_108.data +
                     (uint)(iVar29 % iVar16) * local_108.elemsize * local_a0.cstep +
                     (long)(iVar29 / iVar16) * local_108.cstep * local_108.elemsize);
        local_a0.refcount = (int *)0x0;
        local_a0.elemsize = local_108.elemsize;
        local_a0.elempack = local_108.elempack;
        local_a0.allocator = local_108.allocator;
        local_a0.dims = 2;
        local_a0.w = local_108.w;
        local_a0.h = local_108.h;
        local_a0.d = 1;
        local_a0.c = 1;
        transpose_pack_B_tile_int8(&local_1d8,&local_a0,0x10,uVar25,iVar35,(int)local_a0.cstep);
        iVar29 = iVar29 + 1;
      } while (iVar32 != iVar29);
    }
    uVar37 = local_218;
    uVar20 = local_220;
    piVar26 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar26 != (int *)0x0) {
      LOCK();
      *piVar26 = *piVar26 + -1;
      UNLOCK();
      if (*piVar26 == 0) {
        if (local_188.allocator == (Allocator *)0x0) goto LAB_002828c7;
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_188.cstep = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    Mat::create(&local_188,iVar28,2,opt->workspace_allocator);
    if ((local_188.data == (void *)0x0) || ((long)local_188.c * local_188.cstep == 0)) {
      piVar26 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      iVar29 = -100;
      if (piVar26 == (int *)0x0) goto LAB_00283383;
      LOCK();
      *piVar26 = *piVar26 + -1;
      UNLOCK();
      if (*piVar26 != 0) goto LAB_00283383;
      if (local_188.allocator != (Allocator *)0x0) {
        (*(local_188.allocator)->_vptr_Allocator[3])();
        iVar29 = -100;
        goto LAB_00283383;
      }
LAB_002828ac:
      iVar29 = -100;
      if (local_188.data != (void *)0x0) {
        free(local_188.data);
        iVar29 = -100;
      }
      goto LAB_00283383;
    }
    if (0 < iVar32) {
      iVar29 = 0;
      do {
        iVar28 = (iVar29 / iVar16) * uVar19;
        iVar33 = (int)((long)iVar29 % (long)iVar16) * iVar15;
        uVar25 = (int)local_220 - iVar28;
        if ((int)uVar19 < (int)uVar25) {
          uVar25 = uVar19;
        }
        iVar35 = (int)uVar37 - iVar33;
        if (iVar15 < iVar35) {
          iVar35 = iVar15;
        }
        conv3x3s1_winograd23_transform_input_tile_int8
                  (bottom_blob,&local_188,iVar28,uVar25,iVar33,iVar35,(int)_allocator);
        local_1d8.cstep = (long)local_108.h * (long)local_108.w;
        local_1d8.data =
             (void *)((long)local_108.data +
                     ((long)iVar29 % (long)iVar16 & 0xffffffffU) * local_108.elemsize *
                     local_1d8.cstep +
                     (long)(iVar29 / iVar16) * local_108.cstep * local_108.elemsize);
        local_1d8.refcount._0_4_ = 0;
        local_1d8.refcount._4_4_ = 0;
        local_1d8.elemsize = local_108.elemsize;
        local_1d8.elempack = local_108.elempack;
        local_1d8.allocator = local_108.allocator;
        local_1d8.dims = 2;
        local_1d8.w = local_108.w;
        local_1d8.h = local_108.h;
        local_1d8.d = 1;
        local_1d8.c = 1;
        transpose_pack_B_tile_int8(&local_188,&local_1d8,0x10,uVar25,iVar35,(int)local_1d8.cstep);
        iVar29 = iVar29 + 1;
        uVar37 = local_218;
      } while (iVar32 != iVar29);
    }
    uVar20 = local_220;
    piVar26 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar26 != (int *)0x0) {
      LOCK();
      *piVar26 = *piVar26 + -1;
      UNLOCK();
      if (*piVar26 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
LAB_002828c7:
          uVar20 = local_220;
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  uVar36 = (ulong)local_1dc;
  local_1d8.cstep = 0;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.elemsize = 0;
  local_1d8.elempack = 0;
  local_1d8.allocator = (Allocator *)0x0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  Mat::create(&local_1d8,local_22c * local_1dc * 0x10,1,nT,4,opt->workspace_allocator);
  iVar29 = -100;
  if ((local_1d8.data != (void *)0x0) && ((long)local_1d8.c * local_1d8.cstep != 0)) {
    if (0 < local_1e8) {
      iVar15 = 0;
      do {
        uVar25 = local_22c;
        iVar16 = get_omp_thread_num();
        uVar27 = uVar25 * iVar15;
        uVar19 = (int)local_58 - uVar27;
        if ((int)uVar25 < (int)uVar19) {
          uVar19 = uVar25;
        }
        local_190 = iVar15;
        if (0 < (int)uVar20) {
          top_blob_00 = (Mat *)((long)iVar16 * local_1d8.cstep * local_1d8.elemsize +
                               (long)local_1d8.data);
          local_38 = (long)(int)uVar19;
          local_b0 = (long)(int)uVar27;
          iVar15 = 0;
          local_b8 = (ulong)uVar27;
          local_a8 = (ulong)uVar19;
          do {
            pMVar30 = local_50;
            iVar16 = local_1e0;
            uVar25 = (int)uVar20 - iVar15;
            local_208 = (ulong)uVar25;
            if ((int)uVar36 < (int)uVar25) {
              local_208 = uVar36;
            }
            if (0 < (int)uVar37) {
              iVar28 = (int)local_b8;
              lVar18 = (long)(int)local_22c;
              uVar20 = local_b8 & 0xffffffff;
              uVar37 = uVar37 & 0xffffffff;
              iVar29 = 0;
              do {
                iVar33 = (int)uVar37;
                iVar32 = iVar33;
                if (iVar16 < iVar33) {
                  iVar32 = iVar16;
                }
                local_188.w = pMVar30->w;
                local_188.h = pMVar30->h;
                local_188.elemsize = pMVar30->elemsize;
                local_188.elempack = pMVar30->elempack;
                local_188.allocator = pMVar30->allocator;
                local_188.cstep = (long)local_188.h * (long)local_188.w;
                local_188.data =
                     (void *)((long)pMVar30->data +
                             local_188.elemsize * local_188.cstep * (long)(iVar29 / iVar16) +
                             pMVar30->cstep *
                             (long)(int)((long)((ulong)(uint)(iVar28 >> 0x1f) << 0x20 | uVar20) /
                                        lVar18) * local_188.elemsize);
                local_188.refcount._0_4_ = 0;
                local_188.refcount._4_4_ = 0;
                local_188.dims = 2;
                local_188.d = 1;
                local_188.c = 1;
                local_a0.cstep = (long)local_108.h * (long)local_108.w;
                local_a0.data =
                     (void *)((long)local_108.data +
                             local_a0.cstep * local_108.elemsize * (long)(iVar29 / iVar16) +
                             local_108.cstep * (long)(iVar15 / (int)uVar36) * local_108.elemsize);
                local_a0.refcount = (int *)0x0;
                local_a0.elemsize = local_108.elemsize;
                local_a0.elempack = local_108.elempack;
                local_a0.allocator = local_108.allocator;
                local_a0.dims = 2;
                local_a0.w = local_108.w;
                local_a0.h = local_108.h;
                local_a0.d = 1;
                local_a0.c = 1;
                iVar35 = iVar29 + iVar16;
                iVar21 = (int)local_218;
                gemm_transB_packed_tile_int8
                          (&local_188,&local_a0,top_blob_00,0x10,uVar19,(int)local_208,iVar29,iVar32
                           ,iVar21 <= iVar35);
                uVar37 = (ulong)(uint)-(iVar16 - iVar33);
                iVar29 = iVar35;
              } while (iVar35 < iVar21);
            }
            iVar16 = local_228->w;
            iVar29 = local_228->elempack;
            iVar28 = local_228->h;
            iVar35 = (int)local_228->cstep * iVar29;
            iVar32 = (iVar16 - (iVar16 + 1 >> 0x1f)) + 1 >> 1;
            iVar33 = (int)local_208;
            local_1e4 = iVar33 * 0x10;
            uVar37 = 0;
            if (3 < (int)uVar19) {
              local_210 = CONCAT44(local_210._4_4_,iVar35);
              local_1f0 = local_208 & 0xffffffff;
              local_1f8 = 0;
              local_200 = 0;
              do {
                if (0 < iVar33) {
                  pauVar31 = (undefined1 (*) [16])
                             ((long)&top_blob_00->data + (long)(int)local_1f8 * 4);
                  uVar37 = 0;
                  do {
                    lVar18 = 0x40;
                    pauVar22 = pauVar31;
                    do {
                      auVar39 = vpaddd_avx(*(undefined1 (*) [16])
                                            (*pauVar22 + (long)(iVar33 * 4) * 4),*pauVar22);
                      auVar39 = vpaddd_avx(auVar39,*(undefined1 (*) [16])
                                                    (*pauVar22 + (long)(iVar33 * 8) * 4));
                      auVar41 = vpsubd_avx(*(undefined1 (*) [16])
                                            (*pauVar22 + (long)(iVar33 * 4) * 4),
                                           *(undefined1 (*) [16])
                                            (*pauVar22 + (long)(iVar33 * 8) * 4));
                      auVar41 = vpaddd_avx(auVar41,*(undefined1 (*) [16])
                                                    (*pauVar22 + (long)(iVar33 * 0xc) * 4));
                      *(undefined1 (*) [16])((long)&local_1d8.elemsize + lVar18) = auVar39;
                      *(undefined1 (*) [16])((long)&local_188.data + lVar18) = auVar41;
                      lVar18 = lVar18 + 0x10;
                      pauVar22 = (undefined1 (*) [16])(*pauVar22 + (long)local_1e4 * 4);
                    } while (lVar18 != 0x80);
                    iVar17 = iVar15 + (int)uVar37;
                    iVar21 = iVar17 % iVar32;
                    uVar25 = (iVar17 / iVar32) * 2;
                    pauVar22 = (undefined1 (*) [16])
                               ((long)local_228->data +
                               (long)(iVar21 * 2 * iVar29) * 4 +
                               (long)local_228->w * local_228->elemsize * (long)(int)uVar25 +
                               local_228->cstep * (long)(((int)local_b8 + (int)local_200) / iVar29)
                               * local_228->elemsize);
                    iVar21 = iVar21 * 2 + 1;
                    uVar27 = 0;
                    pMVar30 = &local_188;
                    bVar14 = true;
                    do {
                      bVar38 = bVar14;
                      if ((int)(uVar27 | uVar25) < iVar28) {
                        auVar39._0_8_ = pMVar30->elemsize;
                        auVar39._8_4_ = pMVar30->elempack;
                        auVar39._12_4_ = *(undefined4 *)&pMVar30->field_0x1c;
                        auVar3._0_8_ = pMVar30->data;
                        auVar3._8_8_ = pMVar30->refcount;
                        auVar41 = vpaddd_avx(auVar39,auVar3);
                        auVar4._0_8_ = pMVar30->allocator;
                        auVar4._8_4_ = pMVar30->dims;
                        auVar4._12_4_ = pMVar30->w;
                        auVar39 = vpsubd_avx(auVar39,auVar4);
                        auVar5._0_4_ = pMVar30->h;
                        auVar5._4_4_ = pMVar30->d;
                        auVar5._8_4_ = pMVar30->c;
                        auVar5._12_4_ = *(undefined4 *)&pMVar30->field_0x3c;
                        auVar39 = vpaddd_avx(auVar39,auVar5);
                        auVar41 = vpaddd_avx(auVar41,auVar4);
                        auVar41 = vpsrad_avx(auVar41,2);
                        auVar39 = vpsrad_avx(auVar39,2);
                        if (iVar29 == 1) {
                          *(int *)*pauVar22 = auVar41._0_4_;
                          *(int *)(*pauVar22 + (long)iVar35 * 4) = auVar41._4_4_;
                          *(int *)(*pauVar22 + (long)(iVar35 * 2) * 4) = auVar41._8_4_;
                          *(int *)(*pauVar22 + (long)(iVar35 * 3) * 4) = auVar41._12_4_;
                          if (iVar21 < iVar16) {
                            *(int *)(*pauVar22 + 4) = auVar39._0_4_;
                            *(int *)(*pauVar22 + (long)iVar35 * 4 + 4) = auVar39._4_4_;
                            *(int *)(*pauVar22 + (long)(iVar35 * 2) * 4 + 4) = auVar39._8_4_;
                            *(int *)(*pauVar22 + (long)(iVar35 * 3) * 4 + 4) = auVar39._12_4_;
                          }
                        }
                        else if ((iVar29 == 4) && (*pauVar22 = auVar41, iVar21 < iVar16)) {
                          pauVar22[1] = auVar39;
                        }
                        pauVar22 = (undefined1 (*) [16])(*pauVar22 + (long)(iVar29 * iVar16) * 4);
                      }
                      uVar27 = 1;
                      pMVar30 = (Mat *)&local_188.cstep;
                      bVar14 = false;
                    } while (bVar38);
                    uVar37 = uVar37 + 1;
                    pauVar31 = pauVar31 + 1;
                  } while (uVar37 != local_1f0);
                }
                uVar37 = local_200 + 4;
                uVar20 = local_200 + 7;
                local_1f8 = (ulong)(uint)((int)local_1f8 + iVar33 * 0x40);
                local_200 = uVar37;
              } while (uVar20 < local_a8);
            }
            uVar25 = (uint)uVar37;
            if ((int)(uVar25 | 1) < (int)uVar19) {
              local_1f0 = (ulong)(iVar33 * 2);
              local_40 = local_228->data;
              local_1f8 = local_228->elemsize;
              local_48 = local_228->cstep * local_1f8;
              local_200 = local_208 & 0xffffffff;
              iVar29 = uVar25 * iVar33 * 0x10;
              local_18c = iVar33 * 0x20;
              local_210 = uVar37 & 0xffffffff;
              do {
                if (0 < iVar33) {
                  puVar34 = (ulong *)((long)&top_blob_00->data + (long)iVar29 * 4);
                  uVar37 = 0;
                  do {
                    lVar18 = 4;
                    puVar23 = puVar34;
                    do {
                      auVar40._8_8_ = 0;
                      auVar40._0_8_ = *puVar23;
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = *(ulong *)((long)puVar23 + local_1f0 * 4);
                      auVar39 = vpaddd_avx(auVar42,auVar40);
                      auVar44._8_8_ = 0;
                      auVar44._0_8_ = *(ulong *)((long)puVar23 + (long)(iVar33 * 4) * 4);
                      auVar39 = vpaddd_avx(auVar39,auVar44);
                      *(long *)(&local_1d8.h + lVar18 * 2) = auVar39._0_8_;
                      auVar39 = vpsubd_avx(auVar42,auVar44);
                      auVar43._8_8_ = 0;
                      auVar43._0_8_ = *(ulong *)((long)puVar23 + (long)(iVar33 * 6) * 4);
                      auVar39 = vpaddd_avx(auVar39,auVar43);
                      (&local_188.data)[lVar18] = auVar39._0_8_;
                      lVar18 = lVar18 + 1;
                      puVar23 = (ulong *)((long)puVar23 + (long)(iVar33 * 8) * 4);
                    } while (lVar18 != 8);
                    iVar17 = iVar15 + (int)uVar37;
                    iVar21 = iVar17 % iVar32;
                    uVar25 = (iVar17 / iVar32) * 2;
                    piVar26 = (int *)((long)local_40 +
                                     (long)(iVar21 * 2) * 4 +
                                     (long)local_228->w * local_1f8 * (long)(int)uVar25 +
                                     (local_b0 + local_210) * local_48);
                    uVar27 = 0;
                    pMVar30 = &local_188;
                    bVar14 = true;
                    do {
                      bVar38 = bVar14;
                      if ((int)(uVar27 | uVar25) < iVar28) {
                        iVar17 = *(int *)&pMVar30->refcount;
                        iVar6 = *(int *)((long)&pMVar30->refcount + 4);
                        iVar7 = (int)pMVar30->elemsize;
                        iVar8 = *(int *)((long)&pMVar30->data + 4);
                        iVar9 = *(int *)((long)&pMVar30->elemsize + 4);
                        iVar10 = pMVar30->elempack;
                        iVar11 = *(int *)&pMVar30->field_0x1c;
                        *piVar26 = *(int *)&pMVar30->data + iVar17 + iVar7 >> 2;
                        piVar26[iVar35] = iVar8 + iVar6 + iVar9 >> 2;
                        if (iVar21 * 2 + 1 < iVar16) {
                          piVar26[1] = (iVar17 - iVar7) + iVar10 >> 2;
                          piVar26[(long)iVar35 + 1] = (iVar6 - iVar9) + iVar11 >> 2;
                        }
                        piVar26 = piVar26 + iVar16;
                      }
                      uVar27 = 1;
                      pMVar30 = (Mat *)&local_188.allocator;
                      bVar14 = false;
                    } while (bVar38);
                    uVar37 = uVar37 + 1;
                    puVar34 = puVar34 + 1;
                  } while (uVar37 != local_200);
                }
                uVar37 = local_210 + 2;
                lVar18 = local_210 + 3;
                iVar29 = iVar29 + local_18c;
                local_210 = uVar37;
              } while (lVar18 < local_38);
              uVar25 = (uint)uVar37;
            }
            if ((int)uVar25 < (int)uVar19) {
              pvVar12 = local_228->data;
              sVar13 = local_228->elemsize;
              local_1f0 = local_228->cstep * sVar13;
              local_270 = (ulong)uVar25;
              iVar29 = uVar25 * iVar33 * 0x10;
              do {
                if (0 < iVar33) {
                  piVar26 = (int *)((long)&top_blob_00->data + (long)iVar29 * 4);
                  uVar37 = 0;
                  do {
                    lVar18 = 4;
                    piVar24 = piVar26;
                    do {
                      iVar35 = piVar24[iVar33];
                      iVar21 = piVar24[iVar33 * 2];
                      *(int *)((long)&local_1d8.cstep + lVar18 * 4) = *piVar24 + iVar35 + iVar21;
                      *(int *)((long)&local_188.data + lVar18 * 4) =
                           (iVar35 - iVar21) + piVar24[iVar33 * 3];
                      lVar18 = lVar18 + 1;
                      piVar24 = piVar24 + iVar33 * 4;
                    } while (lVar18 != 8);
                    iVar21 = iVar15 + (int)uVar37;
                    iVar35 = iVar21 % iVar32;
                    uVar25 = (iVar21 / iVar32) * 2;
                    piVar24 = (int *)((long)pvVar12 +
                                     (long)(iVar35 * 2) * 4 +
                                     (long)local_228->w * sVar13 * (long)(int)uVar25 +
                                     (local_270 + local_b0) * local_1f0);
                    uVar27 = 0;
                    pMVar30 = &local_188;
                    bVar14 = true;
                    do {
                      bVar38 = bVar14;
                      if ((int)(uVar27 | uVar25) < iVar28) {
                        iVar21 = *(int *)((long)&pMVar30->data + 4);
                        iVar17 = *(int *)&pMVar30->refcount;
                        iVar6 = *(int *)((long)&pMVar30->refcount + 4);
                        *piVar24 = *(int *)&pMVar30->data + iVar21 + iVar17 >> 2;
                        if (iVar35 * 2 + 1 < iVar16) {
                          piVar24[1] = (iVar21 - iVar17) + iVar6 >> 2;
                        }
                        piVar24 = piVar24 + iVar16;
                      }
                      uVar27 = 1;
                      pMVar30 = (Mat *)&local_188.elemsize;
                      bVar14 = false;
                    } while (bVar38);
                    uVar37 = uVar37 + 1;
                    piVar26 = piVar26 + 1;
                  } while (uVar37 != (local_208 & 0xffffffff));
                }
                local_270 = local_270 + 1;
                iVar29 = iVar29 + local_1e4;
              } while (local_270 != local_a8);
            }
            uVar36 = (ulong)local_1dc;
            iVar15 = iVar15 + local_1dc;
            uVar37 = local_218;
            uVar20 = local_220;
          } while (iVar15 < (int)local_220);
        }
        iVar15 = local_190 + 1;
      } while (iVar15 != local_1e8);
    }
    iVar29 = 0;
  }
  piVar26 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        if (local_1d8.data != (void *)0x0) {
          free(local_1d8.data);
        }
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00283383:
  piVar26 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar29;
}

Assistant:

int conv3x3s1_winograd23_int8_xop(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int nT, const Option& opt)
{
    return conv3x3s1_winograd23_int8(bottom_blob, top_blob, AT, nT, opt);
}